

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O2

int ARKodeSPRKTable_ToButcher
              (ARKodeSPRKTable sprk_table,ARKodeButcherTable *a_ptr,ARKodeButcherTable *b_ptr)

{
  uint uVar1;
  sunrealtype *psVar2;
  sunrealtype *psVar3;
  ARKodeButcherTable B;
  ARKodeButcherTable pAVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  sunrealtype sVar12;
  
  B = ARKodeButcherTable_Alloc(sprk_table->stages,0);
  iVar6 = -0x14;
  if (B != (ARKodeButcherTable)0x0) {
    iVar11 = 0;
    pAVar4 = ARKodeButcherTable_Alloc(sprk_table->stages,0);
    if (pAVar4 == (ARKodeButcherTable)0x0) {
      ARKodeButcherTable_Free(B);
    }
    else {
      uVar1 = sprk_table->stages;
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = (ulong)uVar1;
      }
      while (iVar11 < (int)uVar1) {
        psVar2 = sprk_table->ahat;
        lVar7 = (long)iVar11;
        pAVar4->b[lVar7] = psVar2[lVar7];
        for (lVar9 = 0; lVar9 <= lVar7; lVar9 = lVar9 + 1) {
          pAVar4->A[lVar7][lVar9] = psVar2[lVar9];
        }
        lVar7 = 1;
        for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
          psVar3 = pAVar4->c;
          sVar12 = psVar3[uVar8];
          for (lVar9 = 0; lVar7 != lVar9; lVar9 = lVar9 + 1) {
            sVar12 = sVar12 + psVar2[lVar9];
            psVar3[uVar8] = sVar12;
          }
          lVar7 = lVar7 + 1;
        }
        for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
          psVar2 = sprk_table->a;
          B->b[uVar8] = psVar2[uVar8];
          for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
            B->A[uVar8][uVar10] = psVar2[uVar10];
          }
        }
        uVar8 = uVar5;
        for (uVar10 = 0; uVar10 != uVar5; uVar10 = uVar10 + 1) {
          for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
            B->c[uVar10] = sprk_table->a[uVar8] + B->c[uVar10];
          }
          uVar8 = uVar10 & 0xffffffff;
        }
        iVar6 = sprk_table->q;
        B->q = iVar6;
        pAVar4->q = iVar6;
        B->p = 0;
        pAVar4->p = 0;
        iVar11 = (int)uVar8 + 1;
      }
      *a_ptr = B;
      *b_ptr = pAVar4;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int ARKodeSPRKTable_ToButcher(ARKodeSPRKTable sprk_table,
                              ARKodeButcherTable* a_ptr,
                              ARKodeButcherTable* b_ptr)
{
  int i                = 0;
  int j                = 0;
  ARKodeButcherTable a = NULL;
  ARKodeButcherTable b = NULL;

  a = ARKodeButcherTable_Alloc(sprk_table->stages, SUNFALSE);
  if (!a) { return ARK_MEM_FAIL; }
  b = ARKodeButcherTable_Alloc(sprk_table->stages, SUNFALSE);
  if (!b)
  {
    if (a) { ARKodeButcherTable_Free(a); }
    return ARK_MEM_FAIL;
  }

  /* DIRK table */
  for (i = 0; i < sprk_table->stages; ++i)
  {
    b->b[i] = sprk_table->ahat[i];
    for (j = 0; j <= i; ++j) { b->A[i][j] = sprk_table->ahat[j]; }
    /* Time weights: C_j = sum_{i=0}^{j} b_i */

    /* Time weights: C_j = sum_{i=0}^{j-1} b_i */
    for (j = 0; j < sprk_table->stages; ++j)
    {
      for (i = 0; i <= j; ++i) { b->c[j] += sprk_table->ahat[i]; }
    }

    /* Explicit table */
    for (i = 0; i < sprk_table->stages; ++i)
    {
      a->b[i] = sprk_table->a[i];
      for (j = 0; j < i; ++j) { a->A[i][j] = sprk_table->a[j]; }
    }

    /* Time weights: c_j = sum_{i=0}^{j-1} a_i */
    for (j = 0; j < sprk_table->stages; ++j)
    {
      for (i = 0; i < j; ++i) { a->c[j] += sprk_table->a[i]; }
    }

    /* Set method order */
    a->q = sprk_table->q;
    b->q = sprk_table->q;

    /* No embedding, so set embedding order to 0 */
    a->p = 0;
    b->p = 0;
  }

  *a_ptr = a;
  *b_ptr = b;

  return ARK_SUCCESS;
}